

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_estimator_impl.cc
# Opt level: O0

void __thiscall
webrtc::LevelEstimatorImpl::LevelEstimatorImpl(LevelEstimatorImpl *this,CriticalSection *crit)

{
  RMSLevel *this_00;
  ostream *poVar1;
  FatalMessage local_1a0;
  FatalMessageVoidify local_25 [13];
  CriticalSection *local_18;
  CriticalSection *crit_local;
  LevelEstimatorImpl *this_local;
  
  local_18 = crit;
  crit_local = (CriticalSection *)this;
  LevelEstimator::LevelEstimator(&this->super_LevelEstimator);
  (this->super_LevelEstimator)._vptr_LevelEstimator = (_func_int **)&PTR_Enable_002fc7f0;
  this->crit_ = local_18;
  this->enabled_ = false;
  this_00 = (RMSLevel *)operator_new(0x10);
  RMSLevel::RMSLevel(this_00);
  std::unique_ptr<webrtc::RMSLevel,std::default_delete<webrtc::RMSLevel>>::
  unique_ptr<std::default_delete<webrtc::RMSLevel>,void>
            ((unique_ptr<webrtc::RMSLevel,std::default_delete<webrtc::RMSLevel>> *)&this->rms_,
             this_00);
  if (local_18 != (CriticalSection *)0x0) {
    return;
  }
  rtc::FatalMessageVoidify::FatalMessageVoidify(local_25);
  rtc::FatalMessage::FatalMessage
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/level_estimator_impl.cc"
             ,0x15);
  poVar1 = rtc::FatalMessage::stream(&local_1a0);
  poVar1 = std::operator<<(poVar1,"Check failed: crit");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# ");
  rtc::FatalMessageVoidify::operator&(local_25,poVar1);
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

LevelEstimatorImpl::LevelEstimatorImpl(rtc::CriticalSection* crit)
    : crit_(crit), rms_(new RMSLevel()) {
  RTC_DCHECK(crit);
}